

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O3

void __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::~SCCs(SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
        *this)

{
  _Hash_node_base *p_Var1;
  __buckets_ptr pp_Var2;
  pointer pHVar3;
  pointer pWVar4;
  _Hash_node_base *p_Var5;
  
  p_Var5 = (this->elementInfo)._M_h._M_before_begin._M_nxt;
  while (p_Var5 != (_Hash_node_base *)0x0) {
    p_Var1 = p_Var5->_M_nxt;
    operator_delete(p_Var5,0x30);
    p_Var5 = p_Var1;
  }
  memset((this->elementInfo)._M_h._M_buckets,0,(this->elementInfo)._M_h._M_bucket_count << 3);
  (this->elementInfo)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->elementInfo)._M_h._M_element_count = 0;
  pp_Var2 = (this->elementInfo)._M_h._M_buckets;
  if (&(this->elementInfo)._M_h._M_single_bucket != pp_Var2) {
    operator_delete(pp_Var2,(this->elementInfo)._M_h._M_bucket_count << 3);
  }
  pHVar3 = (this->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pHVar3 != (pointer)0x0) {
    operator_delete(pHVar3,(long)(this->stack).
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar3);
  }
  pWVar4 = (this->workStack).
           super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pWVar4 == (pointer)0x0) {
    return;
  }
  operator_delete(pWVar4,(long)(this->workStack).
                               super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pWVar4);
  return;
}

Assistant:

SCCs(It inputIt, It inputEnd) : inputIt(inputIt), inputEnd(inputEnd) {}